

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlRegTrans *pxVar1;
  xmlRegAtomPtr pxVar2;
  void *pvVar3;
  xmlRegStatePtr pxVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int i;
  long lVar9;
  bool bVar10;
  int len;
  xmlRegExecCtxt execval;
  int local_d4;
  xmlRegExecCtxt local_d0;
  xmlRegStatePtr local_38;
  
  local_d0.status = -1;
  if (content != (xmlChar *)0x0 && comp != (xmlRegexpPtr)0x0) {
    local_d0.index = 0;
    local_d0.nbPush = 0;
    local_d0.status = 0;
    local_d0.determinist = 1;
    local_d0.maxRollbacks = 0;
    local_d0.nbRollbacks = 0;
    local_d0.rollbacks = (xmlRegExecRollback *)0x0;
    local_d0.state = *comp->states;
    local_d0.transno = 0;
    local_d0.transcount = 0;
    local_d0.inputStack = (xmlRegInputTokenPtr)0x0;
    local_d0.inputStackMax = 0;
    local_d0.comp = comp;
    local_d0.inputString = content;
    if ((long)comp->nbCounters < 1) {
      local_d0.counts = (int *)0x0;
    }
    else {
      local_d0.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
      if (local_d0.counts == (int *)0x0) {
        return -5;
      }
      memset(local_d0.counts,0,(long)comp->nbCounters << 2);
    }
    do {
      if ((local_d0.state == (xmlRegStatePtr)0x0) ||
         ((local_d0.inputString[local_d0.index] == '\0' &&
          ((local_d0.state)->type == XML_REGEXP_FINAL_STATE)))) break;
      local_d4 = 1;
      if ((local_d0.inputString[local_d0.index] == '\0') && (local_d0.counts == (int *)0x0)) {
        if (local_d0.transno < (local_d0.state)->nbTrans) {
          if (((local_d0.state)->trans[local_d0.transno].to < 0) ||
             ((pxVar2 = (local_d0.state)->trans[local_d0.transno].atom, pxVar2->min == 0 &&
              (0 < pxVar2->max)))) goto LAB_0017d282;
        }
LAB_0017d620:
        local_d0._0_8_ = local_d0._0_8_ & 0xffffffff;
        xmlFARegExecRollBack(&local_d0);
      }
      else {
LAB_0017d282:
        local_d0.transcount = 0;
        if (local_d0.transno < (local_d0.state)->nbTrans) {
LAB_0017d292:
          if ((local_d0.state)->trans[local_d0.transno].to < 0) goto LAB_0017d566;
          pxVar1 = (local_d0.state)->trans + local_d0.transno;
          lVar8 = (long)pxVar1->count;
          if (-1 < lVar8) {
            if (local_d0.counts == (int *)0x0) {
LAB_0017d64c:
              local_d0.status = 0xfffffffc;
              break;
            }
            iVar5 = (local_d0.comp)->counters[lVar8].min;
            if ((local_d0.counts[lVar8] < iVar5) ||
               (iVar7 = (local_d0.comp)->counters[lVar8].max, iVar7 < local_d0.counts[lVar8]))
            goto LAB_0017d566;
            bVar10 = iVar5 != iVar7;
LAB_0017d4e2:
            if ((pxVar1->nd == 1) ||
               ((bVar10 && -1 < pxVar1->count && (local_d0.transno + 1 < (local_d0.state)->nbTrans))
               )) {
              xmlFARegExecSave(&local_d0);
              if (local_d0.status != 0) break;
            }
            lVar8 = (long)pxVar1->counter;
            if (-1 < lVar8) {
              if (((local_d0.counts == (int *)0x0) || (local_d0.comp == (xmlRegexpPtr)0x0)) ||
                 ((local_d0.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0017d64c;
              if ((local_d0.comp)->counters[lVar8].max <= local_d0.counts[lVar8]) goto LAB_0017d566;
              local_d0.counts[lVar8] = local_d0.counts[lVar8] + 1;
            }
            if ((ulong)(uint)pxVar1->count < 0x123456) {
              if (local_d0.counts == (int *)0x0) goto LAB_0017d64c;
              local_d0.counts[(uint)pxVar1->count] = 0;
            }
            local_d0.state = comp->states[pxVar1->to];
            local_d0.transno = 0;
            if (pxVar1->atom != (xmlRegAtomPtr)0x0) {
              local_d0.index = local_d0.index + local_d4;
            }
            goto LAB_0017d632;
          }
          pxVar2 = pxVar1->atom;
          if (pxVar2 == (xmlRegAtomPtr)0x0) {
LAB_0017d614:
            local_d0.status = 0xfffffffc;
            goto LAB_0017d61c;
          }
          if (local_d0.inputString[local_d0.index] == '\0') {
LAB_0017d4b8:
            if ((pxVar2->min == 0) && (0 < pxVar2->max)) {
              local_d0.transcount = 1;
              local_d4 = 0;
LAB_0017d4e0:
              bVar10 = false;
              goto LAB_0017d4e2;
            }
          }
          else {
            local_d4 = 4;
            iVar5 = xmlGetUTF8Char(local_d0.inputString + local_d0.index,&local_d4);
            if (iVar5 < 0) {
LAB_0017d660:
              local_d0.status = 0xfffffff9;
              break;
            }
            iVar5 = xmlRegCheckCharacter(pxVar2,iVar5);
            if (iVar5 == 0) goto LAB_0017d4b8;
            if (iVar5 == 1) {
              if ((-1 < pxVar2->min) && (0 < pxVar2->max)) {
                local_38 = comp->states[pxVar1->to];
                uVar6 = pxVar1->counter;
                lVar8 = (long)(int)uVar6;
                if (-1 < lVar8) {
                  if (((local_d0.counts == (int *)0x0) || (local_d0.comp == (xmlRegexpPtr)0x0)) ||
                     ((local_d0.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0017d64c;
                  if ((local_d0.comp)->counters[lVar8].max <= local_d0.counts[lVar8])
                  goto LAB_0017d566;
                }
                if (local_d0.transno + 1 < (local_d0.state)->nbTrans) {
                  xmlFARegExecSave(&local_d0);
                  if (local_d0.status != 0) break;
                  uVar6 = pxVar1->counter;
                }
                if (-1 < (int)uVar6) {
                  local_d0.counts[uVar6] = local_d0.counts[uVar6] + 1;
                }
                local_d0.transcount = 1;
                do {
                  iVar5 = local_d0.transno;
                  pxVar4 = local_d0.state;
                  iVar7 = 1;
                  if (local_d0.transcount == pxVar2->max) break;
                  lVar8 = (long)local_d4 + (long)local_d0.index;
                  if (local_d0.inputString[lVar8] == '\0') break;
                  local_d0.index = (int)lVar8;
                  if (pxVar2->min <= local_d0.transcount) {
                    local_d0.transno = -1;
                    local_d0.state = local_38;
                    xmlFARegExecSave(&local_d0);
                    if (local_d0.status != 0) goto LAB_0017d668;
                    lVar8 = (long)local_d0.index;
                  }
                  local_d4 = 4;
                  local_d0.state = pxVar4;
                  local_d0.transno = iVar5;
                  iVar5 = xmlGetUTF8Char(local_d0.inputString + lVar8,&local_d4);
                  if (iVar5 < 0) goto LAB_0017d660;
                  iVar7 = xmlRegCheckCharacter(pxVar2,iVar5);
                  local_d0.transcount = local_d0.transcount + 1;
                } while (iVar7 == 1);
                if (local_d0.transcount < pxVar2->min) {
                  iVar7 = 0;
                }
                if (0 < iVar7) {
                  if (-1 < (long)pxVar1->counter) {
                    if (local_d0.counts == (int *)0x0) goto LAB_0017d64c;
                    local_d0.counts[pxVar1->counter] = local_d0.counts[pxVar1->counter] + -1;
                  }
                  if (iVar7 != 1) goto LAB_0017d566;
                  goto LAB_0017d4e0;
                }
                goto LAB_0017d620;
              }
              goto LAB_0017d4e0;
            }
            if (iVar5 < 0) goto LAB_0017d614;
          }
LAB_0017d566:
          local_d0.transno = local_d0.transno + 1;
          if ((local_d0.state)->nbTrans <= local_d0.transno) goto LAB_0017d61c;
          goto LAB_0017d292;
        }
LAB_0017d61c:
        if ((local_d0.transno != 0) || ((local_d0.state)->nbTrans == 0)) goto LAB_0017d620;
      }
LAB_0017d632:
    } while (local_d0.status == 0);
LAB_0017d668:
    if (local_d0.rollbacks != (xmlRegExecRollback *)0x0) {
      if (0 < local_d0.maxRollbacks && local_d0.counts != (int *)0x0) {
        lVar8 = 0x10;
        lVar9 = 0;
        iVar5 = local_d0.maxRollbacks;
        do {
          pvVar3 = *(void **)((long)&(local_d0.rollbacks)->state + lVar8);
          if (pvVar3 != (void *)0x0) {
            (*xmlFree)(pvVar3);
            iVar5 = local_d0.maxRollbacks;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar9 < iVar5);
      }
      (*xmlFree)(local_d0.rollbacks);
    }
    if (local_d0.state == (xmlRegStatePtr)0x0) {
      local_d0.status = -4;
    }
    else {
      if (local_d0.counts != (int *)0x0) {
        (*xmlFree)(local_d0.counts);
      }
      if (local_d0.status == 0) {
        local_d0.status = 1;
      }
      else if (local_d0.status == -1) {
        local_d0.status = 0;
      }
    }
  }
  return local_d0.status;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}